

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O2

JitPolyEquivalentTypeGuard * __thiscall
Func::CreatePolyEquivalentTypeGuard(Func *this,uint32 objTypeSpecFldId)

{
  int index;
  JitPolyEquivalentTypeGuard *this_00;
  
  EnsureEquivalentTypeGuards(this);
  this_00 = (JitPolyEquivalentTypeGuard *)
            new<NativeCodeData::AllocatorNoFixup<Js::JitPolyEquivalentTypeGuard>>
                      (0x60,(AllocatorNoFixup<Js::JitPolyEquivalentTypeGuard> *)
                            &this->topFunc->nativeCodeDataAllocator,0x40d990);
  index = this->indexedPropertyGuardCount;
  this->indexedPropertyGuardCount = index + 1;
  Js::JitPolyEquivalentTypeGuard::JitPolyEquivalentTypeGuard(this_00,index,objTypeSpecFldId);
  InitializeEquivalentTypeGuard(this,(JitEquivalentTypeGuard *)this_00);
  return this_00;
}

Assistant:

Js::JitPolyEquivalentTypeGuard*
Func::CreatePolyEquivalentTypeGuard(uint32 objTypeSpecFldId)
{
    EnsureEquivalentTypeGuards();

    Js::JitPolyEquivalentTypeGuard* guard = NativeCodeDataNewNoFixup(GetNativeCodeDataAllocator(), Js::JitPolyEquivalentTypeGuard, this->indexedPropertyGuardCount++, objTypeSpecFldId);

    this->InitializeEquivalentTypeGuard(guard);

    return guard;
}